

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::Clog2Function::~Clog2Function(Clog2Function *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~Clog2Function((Clog2Function *)0x948e08);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

Clog2Function() : SystemSubroutine(KnownSystemName::Clog2, SubroutineKind::Function) {}